

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFunction.cpp
# Opt level: O2

float __thiscall nanoNet::ActivationFunction::operator()(ActivationFunction *this,float x)

{
  float fVar1;
  
  switch(this->m_option) {
  case Sigmoid:
    fVar1 = sigmoid_activation(x);
    return fVar1;
  case Tanh:
    fVar1 = tanh_activation(x);
    return fVar1;
  case Relu:
    if (x <= 0.0) {
      x = 0.0;
    }
switchD_00104c02_caseD_3:
    return x;
  case Linear:
    goto switchD_00104c02_caseD_3;
  default:
    fVar1 = expf(-x);
    return 1.0 / (fVar1 + 1.0);
  }
}

Assistant:

float ActivationFunction::operator()(float x) const
{
    switch (m_option)
    {
    case Sigmoid:
        return sigmoid_activation(x);
    case Tanh:
        return tanh_activation(x);
    case Relu:
        return relu_activation(x);
    case Linear:
        return linear_activation(x);
    default:
        return sigmoid_activation(x);
    }
}